

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_extend_rom.hpp
# Opt level: O3

void PatchExtendROM::add_bankswitching_when_checking_save_checksum(ROM *rom)

{
  _func_int **pp_Var1;
  uint32_t uVar2;
  Code *pCVar3;
  Code func;
  DataRegister local_138;
  undefined1 local_128 [24];
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_110;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  _Stack_e0;
  Code local_a8;
  
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262cd8;
  local_138.super_Register._code = 0xf1;
  local_138.super_Register._9_7_ = 0x200a130;
  local_128._0_8_ = &PTR_getXn_00262c98;
  local_128._8_8_ = (pointer)0x1;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::move(&local_a8,(Param *)local_128,(Param *)&local_138,BYTE);
  pp_Var1 = (_func_int **)(local_128 + 0x10);
  local_128._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"loop","");
  md::Code::label(&local_a8,(string *)local_128);
  if ((_func_int **)local_128._0_8_ != pp_Var1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  local_128._0_8_ = &PTR_getXn_00262d18;
  local_128._16_8_ = local_128._16_8_ & 0xffffffffffffff00;
  local_128._8_8_ = &PTR_getXn_00262c50;
  _Stack_110._M_impl._0_3_ = 0x20000;
  local_138.super_Register._code = '\x01';
  local_138.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262be0;
  md::Code::add(&local_a8,(Param *)local_128,&local_138,BYTE,false);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR_getXn_00262c50;
  md::Code::addq(&local_a8,'\x02',(Register *)local_128,WORD);
  local_138.super_Register._code = '\a';
  local_138.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262be0;
  local_128._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"loop","");
  md::Code::dbra(&local_a8,&local_138,(string *)local_128);
  if ((_func_int **)local_128._0_8_ != pp_Var1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  local_128._0_8_ = &PTR_getXn_00262d18;
  local_128._16_8_ = local_128._16_8_ & 0xffffffffffffff00;
  local_128._8_8_ = &PTR_getXn_00262c50;
  _Stack_110._M_impl._0_3_ = 0x20000;
  local_138.super_Register._code = '\x01';
  local_138.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262be0;
  md::Code::cmp(&local_a8,local_128,&local_138);
  local_138.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262cd8;
  local_138.super_Register._code = 0xf1;
  local_138.super_Register._9_7_ = 0x200a130;
  local_128._0_8_ = &PTR_getXn_00262c98;
  local_128._8_8_ = (pointer)0x0;
  md::Code::move(&local_a8,(Param *)local_128,(Param *)&local_138,BYTE);
  md::Code::rts(&local_a8);
  local_128._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"");
  uVar2 = md::ROM::inject_code(rom,&local_a8,(string *)local_128);
  if ((_func_int **)local_128._0_8_ != pp_Var1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  _Stack_110._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_110._M_impl.super__Rb_tree_header._M_header;
  _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_110._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_e0._M_impl._0_8_ = 0;
  _Stack_110._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_110._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128._16_8_ = 0;
  _Stack_110._M_impl._0_8_ = 0;
  local_128._0_8_ = (_func_int **)0x0;
  local_128._8_8_ = (pointer)0x0;
  _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_e0._M_impl.super__Rb_tree_header._M_header;
  _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_e0._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262cd8;
  local_138.super_Register._12_4_ = 2;
  local_138.super_Register._8_4_ = uVar2;
  _Stack_110._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_110._M_impl.super__Rb_tree_header._M_header._M_left;
  _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_left;
  pCVar3 = md::Code::jsr((Code *)local_128,(Param *)&local_138);
  pCVar3 = md::Code::nop(pCVar3,2);
  md::ROM::set_code(rom,0x1574,pCVar3);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&_Stack_e0);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&_Stack_110);
  if ((_func_int **)local_128._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_a8._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a8._pending_branches._M_t);
  if (local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void add_bankswitching_when_checking_save_checksum(md::ROM& rom)
    {
        md::Code func;
        func.moveb(BANK_SRAM, addr_(0xA130F1)); // switch to SRAM
        {
            func.label("loop");
            {
                func.addb(addr_(reg_A0), reg_D1);
                func.addqw(2, reg_A0);
            }
            func.dbra(reg_D7, "loop");
            func.cmpb(addr_(reg_A0), reg_D1);
        }
        func.moveb(BANK_ROM, addr_(0xA130F1)); // switch to ROM
        func.rts();

        uint32_t func_check_save_checkum = rom.inject_code(func);

        rom.set_code(0x1574, md::Code().jsr(func_check_save_checkum).nop(2));
    }